

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

string * __thiscall
leveldb::Version::DebugString_abi_cxx11_(string *__return_storage_ptr__,Version *this)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar1;
  ulong uVar2;
  uint64_t num;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  num = 0;
  do {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,num);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (this->files_[num].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        this->files_[num].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = this->files_ + num;
      uVar2 = 0;
      do {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        AppendNumberTo(__return_storage_ptr__,
                       (pvVar1->
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar2]->number);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        AppendNumberTo(__return_storage_ptr__,
                       (pvVar1->
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar2]->file_size);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        InternalKey::DebugString_abi_cxx11_
                  (&local_50,
                   &(pvVar1->
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar2]->smallest);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        InternalKey::DebugString_abi_cxx11_
                  (&local_50,
                   &(pvVar1->
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar2]->largest);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar2 = uVar2 + 1;
      } while (uVar2 < (ulong)((long)(pvVar1->
                                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar1->
                                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    num = num + 1;
  } while (num != 7);
  return __return_storage_ptr__;
}

Assistant:

std::string Version::DebugString() const {
  std::string r;
  for (int level = 0; level < config::kNumLevels; level++) {
    // E.g.,
    //   --- level 1 ---
    //   17:123['a' .. 'd']
    //   20:43['e' .. 'g']
    r.append("--- level ");
    AppendNumberTo(&r, level);
    r.append(" ---\n");
    const std::vector<FileMetaData*>& files = files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      r.push_back(' ');
      AppendNumberTo(&r, files[i]->number);
      r.push_back(':');
      AppendNumberTo(&r, files[i]->file_size);
      r.append("[");
      r.append(files[i]->smallest.DebugString());
      r.append(" .. ");
      r.append(files[i]->largest.DebugString());
      r.append("]\n");
    }
  }
  return r;
}